

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mipmapped_texture::is_vertical_cross(mipmapped_texture *this)

{
  bool bVar1;
  uint uVar2;
  mipmapped_texture *this_local;
  
  bVar1 = is_valid(this);
  if (bVar1) {
    uVar2 = get_num_faces(this);
    if (uVar2 < 2) {
      bVar1 = math::is_power_of_2(this->m_height);
      if (((!bVar1) || (bVar1 = math::is_power_of_2(this->m_width), bVar1)) ||
         (this->m_height >> 2 != this->m_width / 3)) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool mipmapped_texture::is_vertical_cross() const {
  CRNLIB_ASSERT(is_valid());
  if (!is_valid())
    return false;

  if (get_num_faces() > 1)
    return false;

  if (!((math::is_power_of_2(m_height)) && (!math::is_power_of_2(m_width)) && (m_height / 4U == m_width / 3U)))
    return false;

  return true;
}